

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

void __thiscall
CommandLineArguments::SetRepeatCount(CommandLineArguments *this,int ac,char **av,int *i)

{
  int iVar1;
  size_t sVar2;
  SimpleString repeatParameter;
  SimpleString local_30;
  
  this->repeat_ = 0;
  SimpleString::SimpleString(&local_30,av[*i]);
  sVar2 = SimpleString::size(&local_30);
  if (sVar2 < 3) {
    iVar1 = *i + 1;
    if (iVar1 < ac) {
      iVar1 = SimpleString::AtoI(av[iVar1]);
      this->repeat_ = iVar1;
      if (iVar1 != 0) {
        *i = *i + 1;
      }
    }
  }
  else {
    iVar1 = SimpleString::AtoI(av[*i] + 2);
    this->repeat_ = iVar1;
  }
  if (this->repeat_ == 0) {
    this->repeat_ = 2;
  }
  SimpleString::~SimpleString(&local_30);
  return;
}

Assistant:

void CommandLineArguments::SetRepeatCount(int ac, const char** av, int& i)
{
    repeat_ = 0;

    SimpleString repeatParameter(av[i]);
    if (repeatParameter.size() > 2) repeat_ = SimpleString::AtoI(av[i] + 2);
    else if (i + 1 < ac) {
        repeat_ = SimpleString::AtoI(av[i + 1]);
        if (repeat_ != 0) i++;
    }

    if (0 == repeat_) repeat_ = 2;

}